

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  NewArrayExpressionSyntax *pNVar1;
  Info *args_4;
  Token TVar2;
  Token TVar3;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  Token *args_1;
  
  args_1 = (Token *)__child_stack;
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0xa5b2b6);
  deepClone<slang::syntax::NameSyntax>((NameSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  TVar2 = parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa5b2f3);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  TVar3 = parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  args_4 = TVar3.info;
  if (*(long *)&(((NameSyntax *)((long)__fn + 0x48))->super_ExpressionSyntax).super_SyntaxNode != 0)
  {
    deepClone<slang::syntax::ParenthesizedExpressionSyntax>
              ((ParenthesizedExpressionSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  }
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NewArrayExpressionSyntax,slang::syntax::NameSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ParenthesizedExpressionSyntax*>
                     (unaff_retaddr,(NameSyntax *)__fn,args_1,(ExpressionSyntax *)TVar2.info,
                      TVar2._0_8_,(ParenthesizedExpressionSyntax **)args_4);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NewArrayExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NewArrayExpressionSyntax>(
        *deepClone<NameSyntax>(*node.newKeyword, alloc),
        node.openBracket.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.sizeExpr, alloc),
        node.closeBracket.deepClone(alloc),
        node.initializer ? deepClone(*node.initializer, alloc) : nullptr
    );
}